

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

CTcStreamAnchor * __thiscall
CTcDataStream::add_anchor
          (CTcDataStream *this,CTcSymbol *owner_sym,CTcAbsFixup **fixup_list_head,ulong ofs)

{
  CTcStreamAnchor *this_00;
  ulong in_RCX;
  CTcAbsFixup **in_RDX;
  CTcSymbol *in_RSI;
  size_t in_RDI;
  CTcStreamAnchor *anchor;
  CTcPrsMem *in_stack_ffffffffffffffc8;
  
  this_00 = (CTcStreamAnchor *)CTcCSPrsAllocObj::operator_new(in_RDI,in_stack_ffffffffffffffc8);
  CTcStreamAnchor::CTcStreamAnchor(this_00,in_RSI,in_RDX,in_RCX);
  if (*(long *)(in_RDI + 0x50) == 0) {
    *(CTcStreamAnchor **)(in_RDI + 0x48) = this_00;
  }
  else {
    **(undefined8 **)(in_RDI + 0x50) = this_00;
  }
  *(CTcStreamAnchor **)(in_RDI + 0x50) = this_00;
  return this_00;
}

Assistant:

CTcStreamAnchor *CTcDataStream::add_anchor(CTcSymbol *owner_sym,
                                           CTcAbsFixup **fixup_list_head,
                                           ulong ofs)
{
    CTcStreamAnchor *anchor;
    
    /* allocate the anchor, giving it our current offset */
    anchor = new (allocator_) CTcStreamAnchor(owner_sym,
                                              fixup_list_head, ofs);

    /* append it to our list */
    if (last_anchor_ != 0)
        last_anchor_->nxt_ = anchor;
    else
        first_anchor_ = anchor;
    last_anchor_ = anchor;

    /* return the new anchor */
    return anchor;
}